

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcSymLabel * __thiscall CTcParser::add_code_label(CTcParser *this,CTcToken *tok)

{
  _func_int **pp_Var1;
  CTcSymLabel *pCVar2;
  CTcToken *in_RSI;
  CTcPrsSymtab *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  size_t in_stack_ffffffffffffffe8;
  CTcPrsSymtab *this_00;
  
  this_00 = in_RDI;
  if (in_RDI[5]._vptr_CTcPrsSymtab == (_func_int **)0x0) {
    pp_Var1 = (_func_int **)CTcPrsSymtab::operator_new(0x26a1ac);
    CTcPrsSymtab::CTcPrsSymtab
              ((CTcPrsSymtab *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI)
    ;
    in_RDI[5]._vptr_CTcPrsSymtab = pp_Var1;
  }
  CTcToken::get_text(in_RSI);
  CTcToken::get_text_len(in_RSI);
  pCVar2 = CTcPrsSymtab::add_code_label
                     (this_00,(textchar_t *)in_RSI,in_stack_ffffffffffffffe8,
                      in_stack_ffffffffffffffe4);
  return pCVar2;
}

Assistant:

CTcSymLabel *CTcParser::add_code_label(const CTcToken *tok)
{
    /* if there's no 'goto' symbol table, create one */
    if (goto_symtab_ == 0)
        goto_symtab_ = new CTcPrsSymtab(0);

    /* create the label and return it */
    return goto_symtab_->add_code_label(tok->get_text(),
                                        tok->get_text_len(), FALSE);
}